

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

int convtable(lua_State *L)

{
  table *ptVar1;
  int iVar2;
  context *ctx;
  size_t sVar3;
  uint8_t *puVar4;
  ulong uVar5;
  value *pvVar6;
  lua_Integer lVar7;
  char *pcVar8;
  node *pnVar9;
  ulong in_RCX;
  long lVar10;
  uint *key_00;
  node *n;
  ulong uVar11;
  int *in_R9;
  uint uVar12;
  uint uVar13;
  int key;
  uint local_50;
  int keytype;
  size_t local_48;
  table *local_40;
  size_t local_38;
  
  ctx = (context *)lua_touserdata(L,2);
  ptVar1 = ctx->tbl;
  ptVar1->L = ctx->L;
  sVar3 = lua_rawlen(L,1);
  iVar2 = (int)sVar3;
  if (iVar2 == 0) {
    local_38 = 0;
  }
  else {
    local_38 = (size_t)iVar2;
    puVar4 = (uint8_t *)malloc(local_38);
    ptVar1->arraytype = puVar4;
    if (puVar4 == (uint8_t *)0x0) goto LAB_0012005c;
    uVar5 = 0;
    in_RCX = 0;
    if (0 < iVar2) {
      in_RCX = sVar3 & 0xffffffff;
    }
    for (; in_RCX != uVar5; uVar5 = uVar5 + 1) {
      ptVar1->arraytype[uVar5] = '\0';
    }
    pvVar6 = (value *)malloc((long)(sVar3 << 0x20) >> 0x1d);
    ptVar1->array = pvVar6;
    if (pvVar6 == (value *)0x0) goto LAB_0012005c;
    ptVar1->sizearray = iVar2;
  }
  local_48 = sVar3;
  local_40 = ptVar1;
  lua_pushnil(L);
  uVar13 = 0;
  while (iVar2 = lua_next(L,1), iVar2 != 0) {
    iVar2 = lua_type(L,-2);
    uVar12 = uVar13 + 1;
    if (iVar2 == 3) {
      iVar2 = lua_isinteger(L,-2);
      if (iVar2 == 0) {
        lua_tonumberx(L,-2,(int *)0x0);
        luaL_error(L,"Invalid key %f");
      }
      lVar7 = lua_tointegerx(L,-2,(int *)0x0);
      if ((long)local_38 < lVar7) {
        uVar13 = uVar12;
      }
      if (lVar7 < 1) {
        uVar13 = uVar12;
      }
    }
    else {
      in_RCX = (ulong)(iVar2 - 6U);
      uVar13 = uVar12;
      if (iVar2 - 6U < 0xfffffffe) {
        pcVar8 = lua_typename(L,iVar2);
        luaL_error(L,"Invalid key type %s",pcVar8);
      }
    }
    lua_settop(L,-2);
  }
  if (uVar13 == 0) {
    uVar5 = 0;
    if (0 < (int)local_48) {
      uVar5 = local_48 & 0xffffffff;
    }
    for (lVar10 = 1; lVar10 - uVar5 != 1; lVar10 = lVar10 + 1) {
      lua_rawgeti(L,1,lVar10);
      setarray(ctx,L,(int)lVar10,(int)in_RCX);
      lua_settop(L,-2);
    }
  }
  else {
    pnVar9 = (node *)malloc((long)(int)uVar13 * 0x18);
    local_40->hash = pnVar9;
    if (pnVar9 == (node *)0x0) {
LAB_0012005c:
      iVar2 = luaL_error(L,"memory error");
      return iVar2;
    }
    lVar10 = 0;
    uVar5 = 0;
    if (0 < (int)uVar13) {
      uVar5 = (ulong)uVar13;
    }
    for (; uVar5 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
      *(undefined2 *)(&pnVar9->valuetype + lVar10) = 0;
    }
    local_40->sizehash = uVar13;
    ptVar1 = ctx->tbl;
    lua_pushnil(L);
    while (iVar2 = lua_next(L,1), iVar2 != 0) {
      key_00 = &local_50;
      iVar2 = ishashkey(ctx,L,(int)&key,(int *)key_00,(uint32_t *)&keytype,in_R9);
      if (iVar2 == 0) {
        setarray(ctx,L,key,(int)key_00);
      }
      else {
        pnVar9 = ptVar1->hash;
        uVar5 = (ulong)local_50 % (ulong)(uint)ptVar1->sizehash;
        if (pnVar9[uVar5].valuetype == '\0') {
          pnVar9 = pnVar9 + uVar5;
          pnVar9->key = key;
          pnVar9->keytype = (uint8_t)keytype;
          pnVar9->keyhash = local_50;
          pnVar9->next = -1;
          pnVar9->nocolliding = '\x01';
          setvalue(ctx,L,(int)pnVar9,pnVar9);
        }
      }
      lua_settop(L,-2);
    }
    ptVar1 = ctx->tbl;
    uVar13 = ptVar1->sizehash;
    lua_pushnil(L);
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    while (iVar2 = lua_next(L,1), iVar2 != 0) {
      iVar2 = ishashkey(ctx,L,(int)&key,(int *)&local_50,(uint32_t *)&keytype,in_R9);
      if (iVar2 != 0) {
        pnVar9 = ptVar1->hash;
        uVar5 = (ulong)local_50 % (ulong)(uint)ptVar1->sizehash;
        if ((keytype != (uint)pnVar9[uVar5].keytype) || (pnVar9[uVar5].key != key)) {
          uVar11 = 0;
          n = pnVar9;
          while( true ) {
            if (uVar13 == uVar11) {
              __assert_fail("n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-sharedata.c"
                            ,0x103,"void fillcolliding(lua_State *, struct context *)");
            }
            if (n->valuetype == '\0') break;
            uVar11 = uVar11 + 1;
            n = n + 1;
          }
          n->next = pnVar9[uVar5].next;
          pnVar9[uVar5].next = (int)uVar11;
          pnVar9[uVar5].nocolliding = '\0';
          n->key = key;
          n->keytype = (uint8_t)keytype;
          n->keyhash = local_50;
          n->nocolliding = '\0';
          setvalue(ctx,L,(int)n,n);
        }
      }
      lua_settop(L,-2);
    }
  }
  return 0;
}

Assistant:

static int
convtable(lua_State *L) {
	int i;
	struct context *ctx = lua_touserdata(L,2);
	struct table *tbl = ctx->tbl;

	tbl->L = ctx->L;

	int sizearray = lua_rawlen(L, 1);
	if (sizearray) {
		tbl->arraytype = (uint8_t *)malloc(sizearray * sizeof(uint8_t));
		if (tbl->arraytype == NULL) {
			goto memerror;
		}
		for (i=0;i<sizearray;i++) {
			tbl->arraytype[i] = VALUETYPE_NIL;
		}
		tbl->array = (union value *)malloc(sizearray * sizeof(union value));
		if (tbl->array == NULL) {
			goto memerror;
		}
		tbl->sizearray = sizearray;
	}
	int sizehash = countsize(L, sizearray);
	if (sizehash) {
		tbl->hash = (struct node *)malloc(sizehash * sizeof(struct node));
		if (tbl->hash == NULL) {
			goto memerror;
		}
		for (i=0;i<sizehash;i++) {
			tbl->hash[i].valuetype = VALUETYPE_NIL;
			tbl->hash[i].nocolliding = 0;
		}
		tbl->sizehash = sizehash;

		fillnocolliding(L, ctx);
		fillcolliding(L, ctx);
	} else {
		int i;
		for (i=1;i<=sizearray;i++) {
			lua_rawgeti(L, 1, i);
			setarray(ctx, L, -1, i);
			lua_pop(L,1);
		}
	}

	return 0;
memerror:
	return luaL_error(L, "memory error");
}